

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcEquipmentElement::IfcEquipmentElement(IfcEquipmentElement *this)

{
  IfcEquipmentElement *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcElement).field_0x148,"IfcEquipmentElement");
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__00f6ac08);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEquipmentElement,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEquipmentElement,_0UL> *)
             &(this->super_IfcElement).field_0x138,&PTR_construction_vtable_24__00f6acf8);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0xf6ab00;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0xf6abf0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0xf6ab28;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf6ab50;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0xf6ab78;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0xf6aba0;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0xf6abc8;
  return;
}

Assistant:

IfcEquipmentElement() : Object("IfcEquipmentElement") {}